

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osutils.cpp
# Opt level: O0

VMemInfo * asmjit::OSUtils_GetVMemInfo(void)

{
  int iVar1;
  unsigned_long *puVar2;
  size_t pageSize;
  unsigned_long local_10;
  size_t local_8;
  
  if (OSUtils_GetVMemInfo::vmi.pageSize == 0) {
    iVar1 = getpagesize();
    OSUtils_GetVMemInfo::vmi.pageSize = (size_t)iVar1;
    local_10 = 0x10000;
    local_8 = OSUtils_GetVMemInfo::vmi.pageSize;
    puVar2 = std::max<unsigned_long>(&local_8,&local_10);
    OSUtils_GetVMemInfo::vmi.pageGranularity = *puVar2;
  }
  return &OSUtils_GetVMemInfo::vmi;
}

Assistant:

static const VMemInfo& OSUtils_GetVMemInfo() noexcept {
  static VMemInfo vmi;
  if (ASMJIT_UNLIKELY(!vmi.pageSize)) {
    size_t pageSize = ::getpagesize();
    vmi.pageSize = pageSize;
    vmi.pageGranularity = std::max<size_t>(pageSize, 65536);
  }
  return vmi;
}